

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::SetPolicy(cmMakefile *this,char *id,PolicyStatus status)

{
  bool bVar1;
  ostream *poVar2;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream e;
  PolicyID local_28;
  PolicyStatus local_24;
  PolicyID pid;
  PolicyStatus status_local;
  char *id_local;
  cmMakefile *this_local;
  
  local_24 = status;
  _pid = id;
  id_local = (char *)this;
  bVar1 = cmPolicies::GetPolicyID(id,&local_28);
  if (bVar1) {
    this_local._7_1_ = SetPolicy(this,local_28,local_24);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar2 = std::operator<<((ostream *)local_1a0,"Policy \"");
    poVar2 = std::operator<<(poVar2,_pid);
    std::operator<<(poVar2,"\" is not known to this version of CMake.");
    std::__cxx11::ostringstream::str();
    IssueMessage(this,FATAL_ERROR,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    this_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmMakefile::SetPolicy(const char *id,
                           cmPolicies::PolicyStatus status)
{
  cmPolicies::PolicyID pid;
  if (!cmPolicies::GetPolicyID(id, /* out */ pid))
    {
    std::ostringstream e;
    e << "Policy \"" << id << "\" is not known to this version of CMake.";
    this->IssueMessage(cmake::FATAL_ERROR, e.str());
    return false;
    }
  return this->SetPolicy(pid,status);
}